

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O2

tuple<long,_int> __thiscall
TPZHybridizeHDiv::SplitConnects
          (TPZHybridizeHDiv *this,TPZCompElSide *left,TPZCompElSide *right,
          TPZVec<TPZCompMesh_*> *meshvec_Hybrid)

{
  byte bVar1;
  uchar uVar2;
  TPZCompMesh *mesh;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  TPZCompEl *this_00;
  TPZCompEl *this_01;
  TPZConnect *pTVar8;
  TPZGeoEl *pTVar9;
  TPZCompEl *this_02;
  long *plVar10;
  TPZCompEl *this_03;
  _Head_base<0UL,_long,_false> extraout_RDX;
  long in_R8;
  tuple<long,_int> tVar11;
  TPZGeoElBC gbc;
  TPZGeoElSide gright;
  TPZGeoElSide gleft;
  TPZStack<TPZCompElSide,_10> equalright;
  
  if ((*(int *)&left->fEl == 0) || (*(int *)((long)&left->fEl + 4) == 0)) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0x51);
  }
  mesh = (TPZCompMesh *)**(undefined8 **)(in_R8 + 8);
  TPZCompElSide::Reference(&gleft,right);
  TPZCompElSide::Reference(&gright,(TPZCompElSide *)meshvec_Hybrid);
  if (right->fEl == (TPZCompEl *)0x0) {
    this_00 = (TPZCompEl *)0x0;
  }
  else {
    this_00 = (TPZCompEl *)
              __dynamic_cast(right->fEl,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo);
  }
  if (meshvec_Hybrid->_vptr_TPZVec == (_func_int **)0x0) {
    this_01 = (TPZCompEl *)0x0;
  }
  else {
    this_01 = (TPZCompEl *)
              __dynamic_cast(meshvec_Hybrid->_vptr_TPZVec,&TPZCompEl::typeinfo,
                             &TPZInterpolatedElement::typeinfo);
  }
  (**(code **)(*(long *)this_00 + 0x2f8))(this_00,right->fSide,1);
  (**(code **)(*(long *)this_01 + 0x2f8))(this_01,*(undefined4 *)&meshvec_Hybrid->fStore,1);
  TPZStack<TPZCompElSide,_10>::TPZStack(&equalright);
  pTVar8 = TPZInterpolatedElement::SideConnect((TPZInterpolatedElement *)this_00,0,right->fSide);
  if (pTVar8->fDependList == (TPZDepend *)0x0) {
    TPZCompElSide::SplitConnect(right,(TPZCompElSide *)meshvec_Hybrid);
  }
  else {
    TPZGeoElSide::EqualLevelCompElementList(&gright,&equalright,1,0);
    if (equalright.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements != 0
       ) {
      pTVar9 = TPZCompEl::Reference
                         ((equalright.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fStore)->fEl);
      pTVar9->fReference = (TPZCompEl *)0x0;
    }
    TPZConnect::RemoveDepend(pTVar8);
  }
  bVar1 = (pTVar8->field_2).fCompose.fOrder;
  uVar5 = (uint)bVar1;
  mesh->fDefaultOrder = uVar5;
  pTVar9 = TPZCompEl::Reference(this_01);
  pTVar9->fReference = (TPZCompEl *)0x0;
  (**(code **)(*(long *)this_00 + 0x68))(this_00);
  (**(code **)(*(long *)this_00 + 0x2d8))(this_00,uVar5);
  TPZGeoElBC::TPZGeoElBC(&gbc,&gleft,*(int *)&left->fEl);
  this_02 = TPZCreateApproximationSpace::CreateCompEl(&mesh->fCreate,gbc.fCreatedElement,mesh);
  if ((pTVar8->field_2).fCompose.fOrder != bVar1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0x85);
  }
  if (this_02 == (TPZCompEl *)0x0) {
    plVar10 = (long *)0x0;
  }
  else {
    plVar10 = (long *)__dynamic_cast(this_02,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,
                                     0);
  }
  iVar6 = (**(code **)(*(long *)gbc.fCreatedElement + 0xf0))();
  (**(code **)(*plVar10 + 0x2f8))(plVar10,iVar6 + -1,1);
  pTVar9 = TPZCompEl::Reference(this_00);
  pTVar9->fReference = (TPZCompEl *)0x0;
  pTVar9 = TPZCompEl::Reference(this_02);
  pTVar9->fReference = (TPZCompEl *)0x0;
  if (equalright.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements == 0)
  {
    pTVar9 = TPZCompEl::Reference(this_00);
    pTVar9->fReference = (TPZCompEl *)0x0;
    (**(code **)(*(long *)this_01 + 0x68))(this_01);
    pTVar8 = TPZInterpolatedElement::SideConnect
                       ((TPZInterpolatedElement *)this_01,0,*(int *)&meshvec_Hybrid->fStore);
    uVar2 = (pTVar8->field_2).fCompose.fOrder;
    (**(code **)(*(long *)this_01 + 0x2d8))(this_01,uVar2);
    TPZGeoElBC::TPZGeoElBC(&gbc,&gright,*(int *)&left->fEl);
    this_03 = TPZCreateApproximationSpace::CreateCompEl(&mesh->fCreate,gbc.fCreatedElement,mesh);
    if ((pTVar8->field_2).fCompose.fOrder != uVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
                 ,0x99);
    }
    if (this_03 == (TPZCompEl *)0x0) {
      plVar10 = (long *)0x0;
    }
    else {
      plVar10 = (long *)__dynamic_cast(this_03,&TPZCompEl::typeinfo,
                                       &TPZInterpolatedElement::typeinfo,0);
    }
    iVar6 = (**(code **)(*(long *)gbc.fCreatedElement + 0xf0))();
    (**(code **)(*plVar10 + 0x2f8))(plVar10,iVar6 + -1,1);
    pTVar9 = TPZCompEl::Reference(this_01);
    pTVar9->fReference = (TPZCompEl *)0x0;
    pTVar9 = TPZCompEl::Reference(this_03);
    pTVar9->fReference = (TPZCompEl *)0x0;
  }
  else {
    this_03 = (equalright.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore)
              ->fEl;
  }
  (**(code **)(*(long *)this_02 + 0x68))(this_02);
  (**(code **)(*(long *)this_03 + 0x68))(this_03);
  TPZGeoElBC::TPZGeoElBC(&gbc,&gleft,*(int *)((long)&left->fEl + 4));
  uVar3 = *(undefined4 *)&(gbc.fCreatedElement)->fIndex;
  uVar4 = *(undefined4 *)((long)&(gbc.fCreatedElement)->fIndex + 4);
  (**(code **)(*(long *)this_00 + 0x68))(this_00);
  (**(code **)(*(long *)this_01 + 0x68))(this_01);
  this->fHDivWrapMatid = uVar5;
  this->fLagrangeInterfaceEnd = uVar3;
  (this->fInterfaceMatid).first = uVar4;
  TPZManVector<TPZCompElSide,_10>::~TPZManVector(&equalright.super_TPZManVector<TPZCompElSide,_10>);
  tVar11.super__Tuple_impl<0UL,_long,_int>.super__Head_base<0UL,_long,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar11.super__Tuple_impl<0UL,_long,_int>._0_8_ = this;
  return (tuple<long,_int>)tVar11.super__Tuple_impl<0UL,_long,_int>;
}

Assistant:

std::tuple<int64_t, int> TPZHybridizeHDiv::SplitConnects(const TPZCompElSide &left, const TPZCompElSide &right, TPZVec<TPZCompMesh *> &meshvec_Hybrid) {
    if (fHDivWrapMatid == 0 || fLagrangeInterface == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }
    TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
    //TPZCompMesh *pressuremesh = meshvec[1];
    //TPZGeoMesh *gmesh = fluxmesh->Reference();
    TPZGeoElSide gleft(left.Reference());
    TPZGeoElSide gright(right.Reference());
    TPZInterpolatedElement *intelleft = dynamic_cast<TPZInterpolatedElement *> (left.Element());
    TPZInterpolatedElement *intelright = dynamic_cast<TPZInterpolatedElement *> (right.Element());
    intelleft->SetSideOrient(left.Side(), 1);
    intelright->SetSideOrient(right.Side(), 1);
    TPZStack<TPZCompElSide> equalright;
    TPZConnect &cleft = intelleft->SideConnect(0, left.Side());

    if (cleft.HasDependency()) {
        // check whether the wrap of the large element was already created
        gright.EqualLevelCompElementList(equalright,1,0);
        // only one wrap element should exist
#ifdef PZDEBUG
        if(equalright.size() > 1)
        {
            DebugStop();
        }
        if(equalright.size()==1)
        {
            TPZGeoEl *equalgel = equalright[0].Element()->Reference();
            if(equalgel->Dimension() != fluxmesh->Dimension()-1)
            {
                DebugStop();
            }
        }
#endif
        // reset the reference of the wrap element
        if(equalright.size()) equalright[0].Element()->Reference()->ResetReference();
        cleft.RemoveDepend();
    }
    else
    {
        left.SplitConnect(right);
    }
    int sideorder = cleft.Order();
    fluxmesh->SetDefaultOrder(sideorder);
    // create HDivBound on the sides of the elements
    TPZCompEl *wrap1, *wrap2;
    {
        intelright->Reference()->ResetReference();
        intelleft->LoadElementReference();
        intelleft->SetPreferredOrder(sideorder);
        TPZGeoElBC gbc(gleft, fHDivWrapMatid);
        wrap1 = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cleft.Order() != sideorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrap1);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelleft->Reference()->ResetReference();
        wrap1->Reference()->ResetReference();
    }
    // if the wrap of the large element was not created...
    if(equalright.size() == 0)
    {
        intelleft->Reference()->ResetReference();
        intelright->LoadElementReference();
        TPZConnect &cright = intelright->SideConnect(0,right.Side());
        int rightprevorder = cright.Order();
        intelright->SetPreferredOrder(cright.Order());
        TPZGeoElBC gbc(gright, fHDivWrapMatid);
        wrap2 = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cright.Order() != rightprevorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrap2);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelright->Reference()->ResetReference();
        wrap2->Reference()->ResetReference();
    }
    else
    {
        wrap2 = equalright[0].Element();
    }
    wrap1->LoadElementReference();
    wrap2->LoadElementReference();
    int64_t pressureindex;
    int lagmatid = fLagrangeInterface;
    int pressureorder;
    {
        TPZGeoElBC gbc(gleft, lagmatid);
        pressureindex = gbc.CreatedElement()->Index();
        pressureorder = sideorder;
    }
    intelleft->LoadElementReference();
    intelright->LoadElementReference();
    return std::make_tuple(pressureindex, pressureorder);
}